

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::opimb_fast_end(Alg *this,Graph *graph,double budget,
                   vector<double,_std::allocator<double>_> *budget_list,double epsilon,double feps,
                   double delta,string *model,string *graphname,int mode)

{
  uint uVar1;
  TResult *pTVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  string *psVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong uVar14;
  long *plVar15;
  ulong *puVar16;
  size_t numSamples;
  Graph *graph_00;
  undefined8 uVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double timeb;
  time_t now;
  ofstream outfile;
  double local_518;
  double local_508;
  double local_4d8;
  ulong *local_490;
  long local_488;
  ulong local_480;
  long lStack_478;
  ulong *local_470;
  long local_468;
  ulong local_460;
  long lStack_458;
  long *local_450;
  undefined8 local_448;
  long local_440;
  undefined8 uStack_438;
  long *local_430;
  undefined8 local_428;
  long local_420;
  undefined8 uStack_418;
  long *local_410;
  long local_408;
  long local_400;
  long lStack_3f8;
  Nodelist *local_3f0;
  ulong local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  HyperGraph *local_3c8;
  double local_3c0;
  undefined1 local_3b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string *local_360;
  string *local_358;
  long local_350;
  long local_348;
  double local_340;
  double local_338;
  double local_330;
  HyperGraph *local_328;
  double local_320;
  double local_318;
  double local_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  vector<double,_std::allocator<double>_> local_288;
  vector<double,_std::allocator<double>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  time_t local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  lVar9 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&local_230);
  if (ABS(feps + -0.01) <= 1e-06) {
    dVar21 = 0.437888;
  }
  else if (ABS(feps + -0.05) <= 1e-06) {
    dVar21 = 0.435641;
  }
  else if (ABS(feps + -0.1) <= 1e-06) {
    dVar21 = 0.432857;
  }
  else if (ABS(feps + -0.15) <= 1e-06) {
    dVar21 = 0.430099;
  }
  else {
    if (1e-06 < ABS(feps + -0.2)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = "feps error!";
      __cxa_throw(puVar13,&char_const*::typeinfo,0);
    }
    dVar21 = 0.427369;
  }
  dVar21 = exp((1.0 - feps) * dVar21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Approx: ",8);
  dVar21 = 1.0 - 1.0 / dVar21;
  poVar10 = std::ostream::_M_insert<double>(dVar21);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  dVar25 = 6.0 / delta;
  dVar3 = log(dVar25);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_270,budget_list);
  iVar8 = cal_k_max(&local_270,budget);
  if (local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_288,budget_list);
  cal_k_min(&local_288,budget);
  if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  dVar24 = (double)this->__numV;
  dVar22 = (double)iVar8;
  dVar23 = log(dVar24);
  dVar26 = log(dVar25);
  dVar23 = (dVar23 * dVar22 + dVar26) * dVar21;
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  dVar23 = dVar23 + dVar3 * dVar21;
  dVar26 = (double)this->__numV;
  dVar24 = ((dVar24 + dVar24) * dVar23 * dVar23) / dVar26;
  local_3e8 = (ulong)dVar24;
  local_3e8 = (long)(dVar24 - 9.223372036854776e+18) & (long)local_3e8 >> 0x3f | local_3e8;
  dVar24 = log(dVar26);
  dVar25 = log(dVar25);
  dVar25 = (dVar24 * dVar22 + dVar25) * dVar21;
  local_360 = model;
  local_358 = graphname;
  local_350 = lVar9;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  dVar25 = dVar3 * dVar21 + dVar25;
  dVar25 = ((dVar26 + dVar26) * dVar25 * dVar25) / (epsilon * epsilon * dVar22);
  uVar14 = (ulong)dVar25;
  bVar18 = 0;
  uVar14 = ((long)(dVar25 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) / local_3e8;
  auVar28._8_4_ = (int)(uVar14 >> 0x20);
  auVar28._0_8_ = uVar14;
  auVar28._12_4_ = 0x45300000;
  dVar25 = log((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
  uVar14 = (ulong)(dVar25 / 0.6931471805599453);
  local_348 = ((long)(dVar25 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f |
              uVar14) + 1;
  auVar29._8_4_ = (int)((ulong)local_348 >> 0x20);
  auVar29._0_8_ = local_348;
  auVar29._12_4_ = 0x45300000;
  dVar25 = (((auVar29._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_348) - 4503599627370496.0)) * 3.0) / delta;
  dVar3 = log(dVar25);
  dVar25 = log(dVar25);
  local_3c0 = 0.0;
  local_328 = &this->__hyperG;
  local_3c8 = &this->__hyperGVldt;
  local_330 = (dVar3 + dVar3) / 9.0;
  local_3f0 = &this->__vecSeed;
  local_3e0 = dVar3 * 0.5;
  dVar25 = dVar25 * 0.5;
  local_3d0 = dVar21 - epsilon;
  local_338 = SQRT(local_3e0);
  local_340 = SQRT(dVar25);
  local_4d8 = 0.0;
  local_518 = 0.0;
  bVar4 = false;
  while( true ) {
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    numSamples = local_3e8 << (bVar18 & 0x3f);
    lVar9 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_328,numSamples);
    HyperGraph::build_n_RRsets(local_3c8,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar7;
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    this->__numRRsets = (this->__hyperG).__numRRsets;
    lVar11 = std::chrono::_V2::system_clock::now();
    local_310 = (double)(lVar11 - lVar9) / 1000000000.0;
    dVar24 = max_cover_lazy_budget_fast_end(this,graph_00,budget,budget_list,feps,&local_3c0,mode);
    lVar9 = std::chrono::_V2::system_clock::now();
    local_318 = (double)(lVar9 - lVar11) / 1000000000.0;
    dVar23 = HyperGraph::self_inf_cal(local_3c8,local_3f0);
    dVar26 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    local_3b8._8_4_ = SUB84(dVar26,0);
    local_3b8._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0;
    local_3b8._12_4_ = (int)((ulong)dVar26 >> 0x20);
    dVar26 = dVar24 / dVar21;
    if ((mode == 2) || (dVar22 = dVar24, mode == 1)) {
      if (this->__is_inf_cost == true) {
        dVar22 = dVar26;
        if (this->__boundMin_inf_cost <= dVar26) {
          dVar22 = this->__boundMin_inf_cost;
        }
      }
      else {
        dVar22 = this->__boundMin_inf;
      }
    }
    uVar1 = this->__numV;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"========upper bound ratio: ",0x1b);
    poVar10 = std::ostream::_M_insert<double>(dVar22 / dVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"========",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    dVar26 = (((double)local_3b8._8_8_ + (double)local_3b8._0_8_) * dVar23) / (double)uVar1 +
             local_330;
    auVar30._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar30._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar30._12_4_ = 0x45300000;
    uVar1 = this->__numV;
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    local_3b8._0_8_ = dVar26;
    uVar19 = SUB84(local_338,0);
    uVar20 = (undefined4)((ulong)local_338 >> 0x20);
    if (local_3e0 < 0.0) {
      dVar26 = sqrt(local_3e0);
      uVar19 = SUB84(dVar26,0);
      uVar20 = (undefined4)((ulong)dVar26 >> 0x20);
    }
    local_320 = (double)CONCAT44(uVar20,uVar19);
    dVar26 = (((auVar30._8_8_ - 1.9342813113834067e+25) + (auVar30._0_8_ - 4503599627370496.0)) *
             dVar22) / (double)uVar1 + dVar25;
    if (dVar26 < 0.0) {
      local_3d8 = sqrt(dVar26);
    }
    else {
      local_3d8 = SQRT(dVar26);
    }
    local_508 = local_340;
    if (dVar25 < 0.0) {
      local_508 = sqrt(dVar25);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-FAST-END (",0x15);
    bVar18 = bVar18 + 1;
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") approx. (max-cover): ",0x17);
    dVar27 = ((double)local_3b8._0_8_ - local_320) * ((double)local_3b8._0_8_ - local_320) -
             dVar3 / 18.0;
    dVar26 = 0.0;
    if (0.0 <= dVar27) {
      dVar26 = dVar27;
    }
    dVar26 = dVar26 / ((local_3d8 + local_508) * (local_3d8 + local_508));
    poVar10 = std::ostream::_M_insert<double>(dVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
    poVar10 = std::ostream::_M_insert<double>(dVar24 / dVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"), #RR sets: ",0xd);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_410 = (long *)CONCAT71(local_410._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_410,1);
    local_518 = local_518 + local_310;
    local_4d8 = local_4d8 + local_318;
    if ((local_3d0 <= dVar26) && (bVar4)) break;
    bVar5 = bVar4;
    if (!bVar4) {
      bVar5 = true;
    }
    if (local_3d0 <= dVar26) {
      bVar4 = bVar5;
    }
  }
  pTVar2 = this->__tRes;
  pTVar2->__Approx = dVar26;
  lVar9 = std::chrono::_V2::system_clock::now();
  pTVar2->__RunningTime = (double)(lVar9 - local_350) / 1000000000.0;
  pTVar2 = this->__tRes;
  pTVar2->__Influence = dVar23;
  pTVar2->__InfluenceOriginal = dVar24;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&pTVar2->__VecSeed,local_3f0);
  pTVar2->__SeedSize =
       (int)((ulong)((long)(this->__vecSeed).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->__vecSeed).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf,&this->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf_cost,&this->__vecSeed_inf_cost);
  pTVar2 = this->__tRes;
  pTVar2->__BoundMin_inf = this->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = this->__numRRsets * 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
  poVar10 = std::ostream::_M_insert<double>(dVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", time: ",8);
  poVar10 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  local_410._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_410,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
  poVar10 = std::ostream::_M_insert<double>(local_518);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  dVar21 = local_3c0;
  local_4d8 = local_4d8 - local_3c0;
  poVar10 = std::ostream::_M_insert<double>(local_4d8);
  local_410._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_410,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
  poVar10 = std::ostream::_M_insert<double>(dVar21);
  local_410 = (long *)CONCAT71(local_410._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_410,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed size: ",0xb);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_238 = time((time_t *)0x0);
  ctime(&local_238);
  std::operator+(&local_258,"fast/",local_360);
  psVar6 = local_358;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_258);
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_2f8 = *plVar15;
    lStack_2f0 = plVar12[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *plVar15;
    local_308 = (long *)*plVar12;
  }
  local_300 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_308,(ulong)(psVar6->_M_dataplus)._M_p);
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_2d8 = *plVar15;
    lStack_2d0 = plVar12[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *plVar15;
    local_2e8 = (long *)*plVar12;
  }
  local_2e0 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  puVar16 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar16) {
    local_480 = *puVar16;
    lStack_478 = plVar12[3];
    local_490 = &local_480;
  }
  else {
    local_480 = *puVar16;
    local_490 = (ulong *)*plVar12;
  }
  local_488 = plVar12[1];
  *plVar12 = (long)puVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_380,vsnprintf,0x148,"%f",SUB84(epsilon,0));
  uVar14 = 0xf;
  if (local_490 != &local_480) {
    uVar14 = local_480;
  }
  if (uVar14 < local_380._M_string_length + local_488) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      uVar17 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_380._M_string_length + local_488) goto LAB_0010e607;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_490);
  }
  else {
LAB_0010e607:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_380._M_dataplus._M_p);
  }
  local_450 = &local_440;
  plVar12 = puVar13 + 2;
  if ((long *)*puVar13 == plVar12) {
    local_440 = *plVar12;
    uStack_438 = puVar13[3];
  }
  else {
    local_440 = *plVar12;
    local_450 = (long *)*puVar13;
  }
  local_448 = puVar13[1];
  *puVar13 = plVar12;
  puVar13[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_450);
  puVar16 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar16) {
    local_460 = *puVar16;
    lStack_458 = plVar12[3];
    local_470 = &local_460;
  }
  else {
    local_460 = *puVar16;
    local_470 = (ulong *)*plVar12;
  }
  local_468 = plVar12[1];
  *plVar12 = (long)puVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_3a0,vsnprintf,0x148,"%f",SUB84(feps,0));
  uVar14 = 0xf;
  if (local_470 != &local_460) {
    uVar14 = local_460;
  }
  if (uVar14 < local_3a0._M_string_length + local_468) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      uVar17 = local_3a0.field_2._M_allocated_capacity;
    }
    if (local_3a0._M_string_length + local_468 <= (ulong)uVar17) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_470);
      goto LAB_0010e786;
    }
  }
  puVar13 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_3a0._M_dataplus._M_p);
LAB_0010e786:
  local_430 = &local_420;
  plVar12 = puVar13 + 2;
  if ((long *)*puVar13 == plVar12) {
    local_420 = *plVar12;
    uStack_418 = puVar13[3];
  }
  else {
    local_420 = *plVar12;
    local_430 = (long *)*puVar13;
  }
  local_428 = puVar13[1];
  *puVar13 = plVar12;
  puVar13[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_430);
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_2b8 = *plVar15;
    lStack_2b0 = plVar12[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *plVar15;
    local_2c8 = (long *)*plVar12;
  }
  local_2c0 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_298 = *plVar15;
    lStack_290 = plVar12[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar15;
    local_2a8 = (long *)*plVar12;
  }
  local_2a0 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_400 = *plVar15;
    lStack_3f8 = plVar12[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *plVar15;
    local_410 = (long *)*plVar12;
  }
  local_408 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_410);
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430,local_420 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,local_440 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,local_480 + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  poVar10 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<double>(dVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<double>(dVar24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<double>(dVar26);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<double>(local_518);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  poVar10 = std::ostream::_M_insert<double>(dVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  std::ostream::_M_insert<double>(local_4d8);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return 0.0;
}

Assistant:

double Alg::opimb_fast_end(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-B-FAST-END");
    std::ofstream outfile;
    double e_alpha;
    if (fabs(feps - 0.01) <= 0.000001) {
        e_alpha = exp(0.437888 * (1 - feps));
    }
    else if (fabs(feps - 0.05) <= 0.000001) {
        e_alpha = exp(0.435641 * (1 - feps));
    }
    else if (fabs(feps - 0.1) <= 0.000001) {
        e_alpha = exp(0.432857 * (1 - feps));
    }
    else if (fabs(feps - 0.15) <= 0.000001) {
        e_alpha = exp(0.430099 * (1 - feps));
    }
    else if (fabs(feps - 0.2) <= 0.000001) {
        e_alpha = exp(0.427369 * (1 - feps));
    }
    else {
        throw "feps error!";
    }
    const double approx = 1 - 1.0 / e_alpha;
    std::cout << "Approx: " << approx << std::endl;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, feps, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
//            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-FAST-END (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
            approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            std::cout << "Seed size: " << __vecSeed.size() << std::endl;
            time_t now = time(0);
            char* dt = ctime(&now);
            outfile.open("fast/" + model + "_" + graphname + "_" + std::to_string(epsilon) + "_" + std::to_string(feps)
                         + "_" + dt + ".txt");
            outfile << __tRes.get_running_time() << "," << "," << __numRRsets * 2 << "," <<
            infVldt << "," << "," << infSelf << "," << "," << __vecSeed.size() << "," <<
            approxOPIMC << "," << "," << time1 << "," << timeb << "," << time2 - timeb;
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}